

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O1

bool __thiscall wabt::WastParser::ParseAlignOpt(WastParser *this,uint32_t *out_align)

{
  uint uVar1;
  Location loc;
  TokenType TVar2;
  Result RVar3;
  undefined8 in_R8;
  undefined8 in_R9;
  Token token;
  Token local_68;
  
  TVar2 = Peek(this,0);
  if (TVar2 == AlignEqNat) {
    Consume(&local_68,this);
    if (5 < local_68.token_type_ - AlignEqNat) {
      __assert_fail("HasText()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/token.h"
                    ,0x5b,"string_view wabt::Token::text() const");
    }
    RVar3 = ParseInt32(local_68.field_2.text_.data_,
                       local_68.field_2.text_.data_ + (long)local_68.field_2.literal_.text.data_,
                       out_align,UnsignedOnly);
    if (RVar3.enum_ == Error) {
      loc.filename.data_._4_4_ = local_68.loc.filename.data_._4_4_;
      loc.filename.data_._0_4_ = local_68.loc.filename.data_._0_4_;
      loc.filename.size_._0_4_ = (undefined4)local_68.loc.filename.size_;
      loc.filename.size_._4_4_ = local_68.loc.filename.size_._4_4_;
      loc.field_1.field_0.line = local_68.loc.field_1.field_0.line;
      loc.field_1.field_0.first_column = local_68.loc.field_1.field_0.first_column;
      loc.field_1.field_0.last_column = local_68.loc.field_1.field_0.last_column;
      loc.field_1._12_4_ = local_68.loc.field_1._12_4_;
      Error(this,loc,"invalid alignment \"%.*s\"",local_68.field_2.text_.size_ & 0xffffffff,
            local_68.field_2.text_.data_,in_R8,in_R9);
    }
    uVar1 = *out_align - 1;
    if ((*out_align ^ uVar1) <= uVar1) {
      Error(this,0x19a94a);
    }
  }
  else {
    *out_align = 0xffffffff;
  }
  return TVar2 == AlignEqNat;
}

Assistant:

bool WastParser::ParseAlignOpt(uint32_t* out_align) {
  WABT_TRACE(ParseAlignOpt);
  if (PeekMatch(TokenType::AlignEqNat)) {
    Token token = Consume();
    string_view sv = token.text();
    if (Failed(ParseInt32(sv.begin(), sv.end(), out_align,
                          ParseIntType::UnsignedOnly))) {
      Error(token.loc, "invalid alignment \"" PRIstringview "\"",
            WABT_PRINTF_STRING_VIEW_ARG(sv));
    }

    if (!IsPowerOfTwo(*out_align)) {
      Error(token.loc, "alignment must be power-of-two");
    }

    return true;
  } else {
    *out_align = WABT_USE_NATURAL_ALIGNMENT;
    return false;
  }
}